

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O1

int dmgval(monst *magr,obj *otmp,boolean thrown,monst *mdef)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  permonst *ptr;
  undefined1 auVar4 [16];
  boolean bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  obj **ppoVar9;
  obj *olaunch;
  int tmp;
  int iVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  
  uVar3 = otmp->otyp;
  cVar1 = otmp->oclass;
  if (cVar1 == '\x02') {
    bVar12 = false;
  }
  else if (cVar1 == '\x06') {
    bVar12 = objects[(short)uVar3].oc_subtyp == '\0';
  }
  else {
    bVar12 = true;
  }
  if (uVar3 == 0x120) {
    return 0;
  }
  if (magr == &youmonst) {
    ppoVar9 = &uwep;
LAB_00282ba1:
    olaunch = *ppoVar9;
  }
  else {
    if (magr != (monst *)0x0) {
      ppoVar9 = &magr->mw;
      goto LAB_00282ba1;
    }
    olaunch = (obj *)0x0;
  }
  ptr = mdef->data;
  if (((((olaunch == (obj *)0x0) || (olaunch->oclass != '\x02')) ||
       (2 < (byte)(objects[olaunch->otyp].oc_subtyp - 0x16U))) ||
      ((cVar1 != '\r' && (cVar1 != '\x02')))) ||
     ((2 < (byte)(objects[(short)uVar3].oc_subtyp + 0x18U) ||
      ((int)objects[(short)uVar3].oc_subtyp != -(uint)(byte)objects[olaunch->otyp].oc_subtyp)))) {
    olaunch = (obj *)0x0;
  }
  if (ptr->msize < 3) {
    cVar1 = objects[(short)uVar3].oc_wsdam;
    if ((long)cVar1 == 0) {
      iVar11 = 0;
    }
    else {
      uVar6 = mt_random();
      iVar11 = SUB164(ZEXT416(uVar6) % SEXT816((long)cVar1),0) + 1;
    }
    uVar6 = uVar3 - 6;
    if (uVar6 < 0x3b) {
      if ((0x139850c0400000U >> ((ulong)uVar6 & 0x3f) & 1) != 0) goto switchD_00282ca9_caseD_2c;
      if ((0x428008000000401U >> ((ulong)uVar6 & 0x3f) & 1) != 0) goto switchD_00282ca9_caseD_24;
    }
    if (uVar3 == 0x219) goto switchD_00282ca9_caseD_2d;
    if (uVar3 != 0x217) goto switchD_00282ca9_caseD_1d;
    goto switchD_00282ca9_caseD_24;
  }
  cVar1 = objects[(short)uVar3].oc_wldam;
  if ((long)cVar1 == 0) {
    iVar11 = 0;
  }
  else {
    uVar6 = mt_random();
    iVar11 = SUB164(ZEXT416(uVar6) % SEXT816((long)cVar1),0) + 1;
  }
  if (uVar3 < 0x1c) {
    if (uVar3 == 6) goto switchD_00282ca9_caseD_24;
    if (uVar3 != 0x10) goto switchD_00282ca9_caseD_1d;
switchD_00282ca9_caseD_1c:
    iVar7 = 2;
    iVar10 = -2;
    do {
      uVar6 = mt_random();
      iVar7 = iVar7 + (uVar6 & 3);
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0);
LAB_00282d82:
    iVar11 = iVar7 + iVar11;
    goto switchD_00282ca9_caseD_1d;
  }
  switch(uVar3) {
  case 0x1c:
  case 0x31:
    goto switchD_00282ca9_caseD_1c;
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x26:
  case 0x28:
  case 0x2e:
  case 0x2f:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
    break;
  case 0x27:
  case 0x29:
  case 0x33:
    iVar7 = 2;
    iVar10 = -2;
    do {
      uVar6 = mt_random();
      iVar7 = iVar7 + uVar6 % 6;
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0);
    goto LAB_00282d82;
  case 0x2c:
  case 0x32:
  case 0x40:
switchD_00282ca9_caseD_2c:
    uVar6 = mt_random();
    uVar6 = uVar6 & 3;
    goto LAB_00282dc4;
  case 0x2d:
  case 0x30:
switchD_00282ca9_caseD_2d:
    uVar6 = mt_random();
    uVar6 = uVar6 % 6;
LAB_00282dc4:
    iVar11 = iVar11 + uVar6 + 1;
    break;
  default:
    if (uVar3 != 0x217) {
      if (uVar3 != 0x219) break;
      goto switchD_00282ca9_caseD_2d;
    }
  case 0x24:
  case 0x25:
  case 0x2a:
  case 0x2b:
  case 0x3a:
switchD_00282ca9_caseD_24:
    iVar11 = iVar11 + 1;
  }
switchD_00282ca9_caseD_1d:
  if (!bVar12) {
    iVar11 = iVar11 + otmp->spe;
  }
  if ((((thrown != '\0') && (olaunch != (obj *)0x0)) &&
      ((otmp->oclass == '\r' || (otmp->oclass == '\x02')))) &&
     ((((byte)(objects[otmp->otyp].oc_subtyp + 0x18U) < 3 &&
       (objects[olaunch->otyp].oc_subtyp == '\x17')) && (objects[otmp->otyp].oc_subtyp == -0x17))))
  {
    iVar11 = iVar11 + olaunch->spe;
  }
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  if (((*(ushort *)&objects[(short)uVar3].field_0x11 & 0x180) == 0) &&
     ((ptr->mflags1 & 0x200000) != 0)) {
    iVar11 = 0;
  }
  iVar10 = 0;
  if ((*(ushort *)&objects[(short)uVar3].field_0x11 & 0x1f0) == 0xe0) {
    iVar10 = iVar11;
  }
  if (ptr != mons + 299) {
    iVar10 = iVar11;
  }
  if (((uVar3 == 0x216) && (0 < iVar10)) &&
     (iVar11 = otmp->owt - (uint)objects[0x216].oc_weight,
     iVar11 != 0 && (int)(uint)objects[0x216].oc_weight <= (int)otmp->owt)) {
    uVar6 = mt_random();
    iVar11 = iVar10 + SUB164(ZEXT416(uVar6) % SEXT816((long)((iVar11 / 0xa0) * 4)),0) + 1;
    iVar10 = 0x19;
    if (iVar11 < 0x19) {
      iVar10 = iVar11;
    }
  }
  iVar7 = spec_dbon(otmp,olaunch,thrown,mdef,0x19);
  iVar11 = iVar10;
  if ((thrown != '\0') && (otmp->oclass == '\x02')) {
    bVar2 = objects[otmp->otyp].oc_subtyp;
    if (((2 < (byte)(bVar2 + 0x18)) ||
        ((olaunch != (obj *)0x0 && ((int)objects[olaunch->otyp].oc_subtyp + (int)(char)bVar2 == 0)))
        ) && (((bVar2 & 0xfe) == 0x12 || ((bVar2 - 0xe5 < 4 && (bVar2 - 0xe5 != 2)))))) {
      iVar11 = multishot_max(magr,otmp);
      uVar6 = mt_random();
      auVar4 = ZEXT416(uVar6) % SEXT816((long)iVar11);
      bVar13 = auVar4._0_8_ != 0;
      uVar6 = auVar4._0_4_ + 2U >> 1;
      if (!bVar13 || 0x18 >= iVar7) {
        uVar6 = auVar4._0_4_ + 1;
      }
      iVar11 = uVar6 * iVar10;
      if ((auVar4[0] & (bVar13 && 0x18 < iVar7)) == 1) {
        iVar11 = iVar11 + ((iVar10 - (iVar10 + 1 >> 0x1f)) + 1 >> 1);
      }
    }
  }
  if ((!bVar12) ||
     (((byte)otmp->oclass < 0x11 && ((0x1a000U >> ((byte)otmp->oclass & 0x1f) & 1) != 0)))) {
    uVar6 = 0;
    if (((otmp->field_0x4a & 2) != 0) && (uVar6 = 0, (ptr->mflags2 & 0x202) != 0)) {
      uVar6 = mt_random();
      uVar6 = (uVar6 & 3) + 1;
    }
    if (((byte)(otmp->oclass | 4U) == 6) &&
       (ptr == mons + 0x105 && objects[otmp->otyp].oc_subtyp == '\x03')) {
      uVar8 = mt_random();
      uVar6 = uVar6 + (uVar8 & 3) + 1;
    }
    if (((*(ushort *)&objects[(short)uVar3].field_0x11 & 0x1f0) == 0xe0) &&
       (bVar5 = hates_silver(ptr), bVar5 != '\0')) {
      uVar8 = mt_random();
      uVar6 = uVar6 + uVar8 % 0x14 + 1;
    }
    uVar8 = uVar6 + 1 >> 1;
    if (iVar7 < 0x19) {
      uVar8 = uVar6;
    }
    if (uVar6 < 2) {
      uVar8 = uVar6;
    }
    iVar11 = iVar11 + uVar8;
  }
  if (0 < iVar11) {
    uVar8 = *(uint *)&otmp->field_0x4a >> 8 & 3;
    uVar6 = *(uint *)&otmp->field_0x4a >> 10 & 3;
    if (uVar6 < uVar8) {
      uVar6 = uVar8;
    }
    iVar10 = iVar11 - uVar6;
    iVar11 = 1;
    if (1 < iVar10) {
      iVar11 = iVar10;
    }
  }
  return iVar11;
}

Assistant:

int dmgval(struct monst *magr, struct obj *otmp, boolean thrown,
	   struct monst *mdef)
{
	int tmp = 0, otyp = otmp->otyp;
	const struct permonst *ptr = mdef->data;
	boolean Is_weapon = (otmp->oclass == WEAPON_CLASS || is_weptool(otmp));
	boolean double_damage;
	struct obj *olaunch;

	if (otyp == CREAM_PIE) return 0;

	if (magr == &youmonst)
	    olaunch = uwep;
	else if (magr)
	    olaunch = MON_WEP(magr);
	else
	    olaunch = NULL;
	if (olaunch && (!is_launcher(olaunch) ||
			!ammo_and_launcher(otmp, olaunch)))
	    olaunch = NULL;

	if (bigmonst(ptr)) {
	    if (objects[otyp].oc_wldam)
		tmp = rnd(objects[otyp].oc_wldam);
	    switch (otyp) {
		case IRON_CHAIN:
		case CROSSBOW_BOLT:
		case MORNING_STAR:
		case PARTISAN:
		case RUNESWORD:
		case ELVEN_BROADSWORD:
		case BROADSWORD:	tmp++; break;

		case FLAIL:
		case RANSEUR:
		case VOULGE:		tmp += rnd(4); break;

		case ACID_VENOM:
		case HALBERD:
		case SPETUM:		tmp += rnd(6); break;

		case BATTLE_AXE:
		case BARDICHE:
		case TRIDENT:		tmp += dice(2,4); break;

		case TSURUGI:
		case DWARVISH_MATTOCK:
		case TWO_HANDED_SWORD:	tmp += dice(2,6); break;
	    }
	} else {
	    if (objects[otyp].oc_wsdam)
		tmp = rnd(objects[otyp].oc_wsdam);
	    switch (otyp) {
		case IRON_CHAIN:
		case CROSSBOW_BOLT:
		case MACE:
		case WAR_HAMMER:
		case FLAIL:
		case SPETUM:
		case TRIDENT:		tmp++; break;

		case BATTLE_AXE:
		case BARDICHE:
		case BILL_GUISARME:
		case GUISARME:
		case LUCERN_HAMMER:
		case MORNING_STAR:
		case RANSEUR:
		case BROADSWORD:
		case ELVEN_BROADSWORD:
		case RUNESWORD:
		case VOULGE:		tmp += rnd(4); break;

		case ACID_VENOM:	tmp += rnd(6); break;
	    }
	}

	if (Is_weapon) {
		tmp += otmp->spe;
	}
	if (thrown && olaunch && ammo_and_launcher(otmp, olaunch) &&
	    objects[olaunch->otyp].oc_skill == P_SLING) {
		/* sling enchantment affects firing damage */
		tmp += olaunch->spe;
	}
	/* negative enchantments mustn't produce negative damage */
	if (tmp < 0) tmp = 0;

	if (objects[otyp].oc_material <= LEATHER && thick_skinned(ptr))
		/* thick skinned/scaled creatures don't feel it */
		tmp = 0;
	if (ptr == &mons[PM_SHADE] && objects[otyp].oc_material != SILVER)
		tmp = 0;

	/* "very heavy iron ball"; weight increase is in increments of 160 */
	if (otyp == HEAVY_IRON_BALL && tmp > 0) {
	    int wt = (int)objects[HEAVY_IRON_BALL].oc_weight;

	    if ((int)otmp->owt > wt) {
		wt = ((int)otmp->owt - wt) / 160;
		tmp += rnd(4 * wt);
		if (tmp > 25) tmp = 25;	/* objects[].oc_wldam */
	    }
	}

	double_damage = (spec_dbon(otmp, olaunch, thrown, mdef, 25) >= 25);

	/* Damage multiplier to replace multishot for heavy shot projectiles. */
	if (thrown && is_heavyshot(otmp, olaunch)) {
	    int multi_heavy = rnd(multishot_max(magr, otmp));
	    boolean odd_adjusted_multi = FALSE;
	    int old_tmp = tmp;

	    /* Make this cumulative with double damage bonus rather than
	       stacking them, so double damage is effectively +1 multiplier. */
	    if (multi_heavy > 1 && double_damage) {
		odd_adjusted_multi = !!((multi_heavy + 1) & 1);
		multi_heavy = (multi_heavy + 1) / 2;
	    }

	    tmp *= multi_heavy;

	    /* if the multiplier got rounded for double damage adjustment,
	       add the extra half now */
	    if (odd_adjusted_multi && double_damage)
		tmp += (old_tmp + 1) / 2;
	}

/*	Put weapon vs. monster type damage bonuses in below:	*/
	if (Is_weapon || otmp->oclass == GEM_CLASS ||
		otmp->oclass == BALL_CLASS || otmp->oclass == CHAIN_CLASS) {
	    int bonus = 0;

	    if (otmp->blessed && (is_undead(ptr) || is_demon(ptr)))
		bonus += rnd(4);
	    if (is_axe(otmp) && is_wooden(ptr))
		bonus += rnd(4);
	    if (objects[otyp].oc_material == SILVER && hates_silver(ptr))
		bonus += rnd(20);

	    /* if the weapon is going to get a double damage bonus, adjust
	       this bonus so that effectively it's added after the doubling */
	    if (bonus > 1 && double_damage)
		bonus = (bonus + 1) / 2;

	    tmp += bonus;
	}

	if (tmp > 0) {
		/* It's debateable whether a rusted blunt instrument
		   should do less damage than a pristine one, since
		   it will hit with essentially the same impact, but
		   there ought to some penalty for using damaged gear
		   so always subtract erosion even for blunt weapons. */
		tmp -= greatest_erosion(otmp);
		if (tmp < 1) tmp = 1;
	}

	return tmp;
}